

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_get_info.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  int cost;
  char *local_108;
  char *algo;
  option long_options [6];
  
  cost = 0;
  algo = (char *)0x0;
  memcpy(long_options,&PTR_anon_var_dwarf_27_00107d20,0xc0);
  msgno = 0;
  local_108 = (char *)0x0;
  while( true ) {
    while( true ) {
      while (iVar1 = getopt_long(argc,argv,"h:vVH",long_options,0), iVar1 == 0x71) {
        msgno = -1;
      }
      if (iVar1 != 0x76) break;
      if (_optarg == (char *)0x0) {
        msgno = msgno + 1;
      }
      else {
        msgno = atoi(_optarg);
      }
    }
    if (iVar1 == -1) {
      iVar1 = password_get_info(local_108,&algo,&cost);
      if (iVar1 != 0) {
        return 0;
      }
      printf("algorithm = %s\n",algo);
      printf("cost = %d\n",(ulong)(uint)cost);
      return 0;
    }
    if (iVar1 == 0x56) {
      printf("PHP Password Hashing version: %d.%d.%d\n",0,1,0);
      return 0;
    }
    if (iVar1 != 0x68) break;
    local_108 = _optarg;
  }
  pcVar2 = __xpg_basename(*argv);
  printf("Usage: %s -h <HASH>\n\n",pcVar2);
  puts("  -h, --hash=HASH password hashed");
  puts("  -V, --version   print version");
  return -1;
}

Assistant:

int
main(int argc, char **argv)
{
    char *hash = NULL;
    int cost = 0;
    char *algo = NULL;
    size_t len;

    int opt;
    const struct option long_options[] = {
        { "hash", 1, NULL, 'h' },
        { "verbose", 1, NULL, 'v' },
        { "quiet", 0, NULL, 'q' },
        { "version", 0, NULL, 'V' },
        { "help", 0, NULL, 'H' },
        { NULL, 0, NULL, 0 }
    };

    msgno = 0;

    while ((opt = getopt_long(argc, argv, "h:vVH",
                              long_options, NULL)) != -1) {
        switch (opt) {
            case 'h':
                hash = optarg;
                break;
            case 'v':
                if (optarg) {
                    msgno = atoi(optarg);
                } else {
                    msgno += 1;
                }
                break;
            case 'q':
                msgno = -1;
                break;
            case 'V':
                printf("PHP Password Hashing version: %d.%d.%d\n",
                       PHP_PASSWORD_VERSION_MAJOR,
                       PHP_PASSWORD_VERSION_MINOR,
                       PHP_PASSWORD_VERSION_BUILD);
                return 0;
            case 'H':
            default:
                usage(argv[0]);
                return -1;
        }
    }

    if (password_get_info(hash, &algo, &cost) == 0) {
        printf("algorithm = %s\n", algo);
        printf("cost = %d\n", cost);
    }

    return 0;
}